

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O2

void __thiscall
Projection::doMLMGNodalProjection
          (Projection *this,int c_lev,int nlevel,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *vel,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *sig,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *rhcc,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *rhnd,Real rel_tol,
          Real abs_tol,bool increment_gp,MultiFab *sync_resid_crse,MultiFab *sync_resid_fine,
          bool doing_initial_vortproj)

{
  int iVar1;
  pointer ppMVar2;
  BCRec *pBVar3;
  pointer pGVar4;
  pointer pIVar5;
  undefined8 uVar6;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> dst;
  Real time;
  IndexType IVar7;
  AmrLevel *pAVar8;
  long lVar9;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *extraout_RDX;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *extraout_RDX_00;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *extraout_RDX_01;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a_00;
  size_type __n;
  array<amrex::LinOpBCType,_3UL> *paVar10;
  LinOpBCType LVar11;
  ulong uVar12;
  long lVar13;
  __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
  _Var14;
  long lVar15;
  int lev;
  ulong uVar16;
  long lVar17;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> gradphi;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> rhcc_rebase;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> rhnd_rebase;
  LPInfo local_328;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> mg_geom;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> sigma_rebase;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> vel_rebase;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> phi_rebase;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> mg_dmap;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> mg_grids;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> phi_test;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> vel_test;
  NodalProjector nodal_projector;
  BoxArray local_98;
  
  __n = (size_type)nlevel;
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::vector
            (&vel_test.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,__n,
             (allocator_type *)&nodal_projector);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::vector
            (&phi_test.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,__n,
             (allocator_type *)&nodal_projector);
  ppMVar2 = (rhcc->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar9 = (long)c_lev;
  if ((ppMVar2 !=
       (rhcc->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (IVar7 = amrex::BATransformer::index_type
                        (&(ppMVar2[lVar9]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          boxarray.m_bat), IVar7.itype != 0)) {
    amrex::Assert_host("rhcc[c_lev]->boxArray().ixType().cellCentered()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/Projection.cpp"
                       ,0x990,(char *)0x0);
  }
  ppMVar2 = (rhnd->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ppMVar2 !=
       (rhnd->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (IVar7 = amrex::BATransformer::index_type
                        (&(ppMVar2[lVar9]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          boxarray.m_bat), IVar7.itype != 7)) {
    amrex::Assert_host("rhnd[c_lev]->boxArray().ixType().nodeCentered()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/Projection.cpp"
                       ,0x993,(char *)0x0);
  }
  set_boundary_velocity(this,c_lev,nlevel,vel,true);
  pBVar3 = this->phys_bc;
  pGVar4 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = 0;
  do {
    if (lVar13 == 3) {
      std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
                (&mg_geom.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,__n,
                 (allocator_type *)&nodal_projector);
      std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
                (&mg_grids.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,__n,
                 (allocator_type *)&nodal_projector);
      std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
                (&mg_dmap.
                  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 ,__n,(allocator_type *)&nodal_projector);
      uVar12 = 0;
      uVar16 = (ulong)(uint)nlevel;
      if (nlevel < 1) {
        uVar16 = uVar12;
      }
      lVar15 = 0;
      lVar13 = lVar9;
      for (lVar17 = 0; uVar16 * 0x19 - lVar17 != 0; lVar17 = lVar17 + 0x19) {
        memcpy(((mg_geom.super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_CoordSys).offset + lVar17 + -1,
               (void *)((long)((this->parent->super_AmrCore).super_AmrMesh.geom.
                               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar9) + lVar17 * 8),200)
        ;
        amrex::BoxArray::operator=
                  ((BoxArray *)
                   ((long)&((mg_grids.
                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type + lVar15),
                   (BoxArray *)
                   ((long)((this->parent->super_AmrCore).super_AmrMesh.grids.
                           super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar9) + lVar15));
        std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((mg_dmap.
                             super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             .
                             super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + uVar12),
                   (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)(*(long *)&((this->LevelData).
                                         super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                         .
                                         super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar13]->state).
                                        super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                                        .
                                        super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                             + 200) + 0x70));
        lVar15 = lVar15 + 0x68;
        uVar12 = uVar12 + 0x10;
        lVar13 = lVar13 + 1;
      }
      local_328.do_semicoarsening = false;
      local_328.agg_grid_size = -1;
      local_328.con_grid_size = -1;
      local_328.has_metric_term = true;
      local_328.max_coarsening_level = 0x1e;
      local_328.max_semicoarsening_level = 0;
      local_328.semicoarsening_direction = -1;
      local_328.hidden_direction = -1;
      if (-1 < (int)(anonymous_namespace)::max_coarsening_level) {
        local_328.max_semicoarsening_level = 0;
        local_328.max_coarsening_level = (anonymous_namespace)::max_coarsening_level;
      }
      local_328.do_agglomeration = (bool)(anonymous_namespace)::agglomeration;
      local_328.do_consolidation = (bool)(anonymous_namespace)::consolidation;
      _Var14._M_current =
           (phi->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
           super__Vector_impl_data._M_start + lVar9;
      std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
      vector<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>,void>
                ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)&phi_rebase,_Var14,
                 (__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                  )(_Var14._M_current + __n),(allocator_type *)&nodal_projector);
      _Var14._M_current =
           (vel->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
           super__Vector_impl_data._M_start + lVar9;
      std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
      vector<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>,void>
                ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)&vel_rebase,_Var14,
                 (__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                  )(_Var14._M_current + __n),(allocator_type *)&nodal_projector);
      _Var14._M_current =
           (sig->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
           super__Vector_impl_data._M_start + lVar9;
      std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
      vector<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>,void>
                ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)&sigma_rebase,_Var14,
                 (__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                  )(_Var14._M_current + __n),(allocator_type *)&nodal_projector);
      rhnd_rebase.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
      super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rhnd_rebase.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
      super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rhnd_rebase.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
      super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      rhcc_rebase.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rhcc_rebase.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rhcc_rebase.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ppMVar2 = (rhnd->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      a = extraout_RDX;
      if (ppMVar2 !=
          (rhnd->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ppMVar2 = ppMVar2 + lVar9;
        std::vector<amrex::MultiFab_const*,std::allocator<amrex::MultiFab_const*>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>>
                  ((vector<amrex::MultiFab_const*,std::allocator<amrex::MultiFab_const*>> *)
                   &rhnd_rebase,ppMVar2,ppMVar2 + __n);
        a = extraout_RDX_00;
      }
      ppMVar2 = (rhcc->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppMVar2 !=
          (rhcc->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ppMVar2 = ppMVar2 + lVar9;
        std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>>
                  ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)&rhcc_rebase,ppMVar2
                   ,ppMVar2 + __n);
        a = extraout_RDX_01;
      }
      amrex::GetVecOfConstPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
                ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 &gradphi,(amrex *)&sigma_rebase,a);
      Hydro::NodalProjector::NodalProjector
                (&nodal_projector,&vel_rebase,
                 (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 &gradphi,&mg_geom,&local_328,&rhcc_rebase,&rhnd_rebase);
      std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
      ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                     *)&gradphi);
      Hydro::NodalProjector::setDomainBC(&nodal_projector,mlmg_lobc,mlmg_hibc);
      *(undefined1 *)
       ((long)nodal_projector.m_linop._M_t.
              super___uniq_ptr_impl<amrex::MLNodeLaplacian,_std::default_delete<amrex::MLNodeLaplacian>_>
              ._M_t.
              super__Tuple_impl<0UL,_amrex::MLNodeLaplacian_*,_std::default_delete<amrex::MLNodeLaplacian>_>
              .super__Head_base<0UL,_amrex::MLNodeLaplacian_*,_false>._M_head_impl + 0x640) =
           (anonymous_namespace)::use_gauss_seidel;
      *(undefined1 *)
       ((long)nodal_projector.m_linop._M_t.
              super___uniq_ptr_impl<amrex::MLNodeLaplacian,_std::default_delete<amrex::MLNodeLaplacian>_>
              ._M_t.
              super__Tuple_impl<0UL,_amrex::MLNodeLaplacian_*,_std::default_delete<amrex::MLNodeLaplacian>_>
              .super__Head_base<0UL,_amrex::MLNodeLaplacian_*,_false>._M_head_impl + 0x641) =
           (anonymous_namespace)::use_harmonic_average;
      *(undefined4 *)
       ((long)nodal_projector.m_mlmg._M_t.
              super___uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>._M_t.
              super__Tuple_impl<0UL,_amrex::MLMG_*,_std::default_delete<amrex::MLMG>_>.
              super__Head_base<0UL,_amrex::MLMG_*,_false>._M_head_impl + 0x1c) =
           (anonymous_namespace)::max_fmg_iter;
      if (sync_resid_fine != (MultiFab *)0x0) {
        nodal_projector.m_sync_resid_fine = sync_resid_fine;
      }
      if (sync_resid_crse != (MultiFab *)0x0) {
        pIVar5 = (this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)pIVar5[lVar9].vect;
        iVar1 = *(int *)((long)(pIVar5 + lVar9) + 8);
        amrex::BoxArray::BoxArray
                  (&local_98,
                   (this->parent->super_AmrCore).super_AmrMesh.grids.
                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar9 + 1);
        nodal_projector.m_sync_resid_crse = sync_resid_crse;
        nodal_projector.m_ref_ratio.vect._0_8_ = uVar6;
        nodal_projector.m_ref_ratio.vect[2] = iVar1;
        amrex::BoxArray::operator=(&nodal_projector.m_fine_grids,&local_98);
        amrex::BoxArray::~BoxArray(&local_98);
      }
      Hydro::NodalProjector::project(&nodal_projector,&phi_rebase,rel_tol,abs_tol);
      amrex::GetVecOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
                (&gradphi,(amrex *)&nodal_projector.m_fluxes,a_00);
      for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
        pAVar8 = (this->LevelData).
                 super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                 super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9 + uVar12];
        if (pAVar8 == (AmrLevel *)0x0) {
          pAVar8 = (AmrLevel *)0x0;
        }
        else {
          pAVar8 = (AmrLevel *)
                   __dynamic_cast(pAVar8,&amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo);
        }
        dst.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (pAVar8->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start[2].new_data._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        if (increment_gp) {
          amrex::MultiFab::Add
                    ((MultiFab *)
                     dst.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                     gradphi.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar12],0,0,3,0);
        }
        else {
          amrex::MultiFab::Copy
                    ((MultiFab *)
                     dst.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                     gradphi.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar12],0,0,3,0);
        }
        time = amrex::StateData::curTime
                         ((pAVar8->state).
                          super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                          super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                          _M_impl.super__Vector_impl_data._M_start + 2);
        amrex::AmrLevel::FillPatch
                  (pAVar8,(MultiFab *)
                          dst.
                          super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                          .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                   ((IntVect *)
                   ((long)dst.
                          super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                          .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->
                   vect[0],time,2,0,3,0);
      }
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&gradphi);
      Hydro::NodalProjector::~NodalProjector(&nodal_projector);
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&rhcc_rebase
                );
      std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
      ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                     *)&rhnd_rebase);
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 &sigma_rebase);
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&vel_rebase)
      ;
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&phi_rebase)
      ;
      std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
                (&mg_dmap.
                  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                );
      std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
                (&mg_grids.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
      std::_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~_Vector_base
                ((_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&mg_geom);
      std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~vector
                (&phi_test.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>);
      std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~vector
                (&vel_test.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>);
      return;
    }
    paVar10 = &mlmg_lobc;
    if (*(char *)((long)(pGVar4 + lVar9) + 0x51U + lVar13) == '\x01') {
      mlmg_hibc._M_elems[lVar13] = Periodic;
      LVar11 = Periodic;
    }
    else if (doing_initial_vortproj) {
      mlmg_hibc._M_elems[lVar13] = Dirichlet;
LAB_00255e9c:
      LVar11 = Dirichlet;
    }
    else {
      iVar1 = pBVar3->bc[lVar13];
      LVar11 = (uint)(iVar1 == 1) * 4 + Neumann;
      if (iVar1 == 2) {
        LVar11 = Dirichlet;
      }
      mlmg_lobc._M_elems[lVar13] = LVar11;
      iVar1 = pBVar3->bc[lVar13 + 3];
      paVar10 = &mlmg_hibc;
      if (iVar1 == 1) {
        LVar11 = inflow;
      }
      else {
        if (iVar1 == 2) goto LAB_00255e9c;
        LVar11 = Neumann;
      }
    }
    paVar10->_M_elems[lVar13] = LVar11;
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

void Projection::doMLMGNodalProjection (int c_lev, int nlevel,
                                        const Vector<MultiFab*>& vel,
                                        const Vector<MultiFab*>& phi,
                                        const Vector<MultiFab*>& sig,
                                        const Vector<MultiFab*>& rhcc,
                                        const Vector<MultiFab*>& rhnd,
                                        Real rel_tol, Real abs_tol,
                                        bool increment_gp,
                                        MultiFab* sync_resid_crse,
                                        MultiFab* sync_resid_fine,
                                        bool doing_initial_vortproj)
{
    BL_PROFILE("Projection:::doMLMGNodalProjection()");

    int f_lev = c_lev + nlevel - 1;

    Vector<MultiFab> vel_test(nlevel);
    Vector<MultiFab> phi_test(nlevel);

    AMREX_ASSERT(vel[c_lev]->nGrow() >= 1);
    AMREX_ASSERT(vel[f_lev]->nGrow() >= 1);
    AMREX_ASSERT(phi[c_lev]->nGrow() == 1);
    AMREX_ASSERT(phi[f_lev]->nGrow() == 1);
    // MLMG does not copy any ghost cells from sig, rhcc or rhnd; fills ghost cells internally
    // AMREX_ASSERT(sig[c_lev]->nGrow() == 1);
    // AMREX_ASSERT(sig[f_lev]->nGrow() == 1);

    AMREX_ASSERT(sig[c_lev]->nComp() == 1);
    AMREX_ASSERT(sig[f_lev]->nComp() == 1);

    if (sync_resid_crse != 0) {
        AMREX_ASSERT(nlevel == 1);
        AMREX_ASSERT(c_lev < parent->finestLevel());
    }

    if (sync_resid_fine != 0) {
        AMREX_ASSERT((nlevel == 1 || nlevel == 2));
        AMREX_ASSERT(c_lev > 0);
    }

    if (!rhcc.empty() )
        AMREX_ALWAYS_ASSERT(rhcc[c_lev]->boxArray().ixType().cellCentered());

    if (!rhnd.empty() )
        AMREX_ALWAYS_ASSERT(rhnd[c_lev]->boxArray().ixType().nodeCentered());

    set_boundary_velocity(c_lev, nlevel, vel, true);

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        if (parent->Geom(c_lev).isPeriodic(idim))
        {
            mlmg_lobc[idim] = mlmg_hibc[idim] = LinOpBCType::Periodic;
        }
        else if (doing_initial_vortproj)
        {
            mlmg_lobc[idim] = mlmg_hibc[idim] = LinOpBCType::Dirichlet;
        }
        else
        {
            if (phys_bc->lo(idim) == Outflow) {
                mlmg_lobc[idim] = LinOpBCType::Dirichlet;
            } else if (phys_bc->lo(idim) == Inflow) {
                mlmg_lobc[idim] = LinOpBCType::inflow;
            } else {
                mlmg_lobc[idim] = LinOpBCType::Neumann;
            }

            if (phys_bc->hi(idim) == Outflow) {
                mlmg_hibc[idim] = LinOpBCType::Dirichlet;
            } else if (phys_bc->hi(idim) == Inflow) {
                mlmg_hibc[idim] = LinOpBCType::inflow;
            } else {
                mlmg_hibc[idim] = LinOpBCType::Neumann;
            }
        }
    }

    //
    // Setup objects for projection
    //
    Vector<Geometry>            mg_geom(nlevel);
    Vector<BoxArray>            mg_grids(nlevel);
    Vector<DistributionMapping> mg_dmap(nlevel);

    for (int lev(0); lev < nlevel; lev++)
    {
        mg_geom[lev] = parent->Geom(lev+c_lev);
        mg_grids[lev] = parent->boxArray(lev+c_lev);
        mg_dmap[lev] = LevelData[lev+c_lev]->get_new_data(State_Type).DistributionMap();
    }

    // Setup infos to pass to linear operator
    LPInfo info;

    if (max_coarsening_level >= 0 ) {
	info.setMaxCoarseningLevel(max_coarsening_level);
    }
    info.setAgglomeration(agglomeration);
    info.setConsolidation(consolidation);
    // metric term stuff doesn't get used at all for nodal
    //info.setMetricTerm(false);

    //
    // Setup variables to use in projection
    //
    Vector<MultiFab*> phi_rebase(phi.begin()+c_lev, phi.begin()+c_lev+nlevel);
    Vector<MultiFab*> vel_rebase{vel.begin()+c_lev, vel.begin()+c_lev+nlevel};
    Vector<MultiFab*> sigma_rebase(sig.begin()+c_lev, sig.begin()+c_lev+nlevel);

    Vector<const MultiFab*> rhnd_rebase;
    Vector<MultiFab*> rhcc_rebase;

    if (!rhnd.empty())
    {
        rhnd_rebase.assign(rhnd.begin()+c_lev, rhnd.begin()+c_lev+nlevel);
    }

    if (!rhcc.empty())
    {
        rhcc_rebase.assign(rhcc.begin()+c_lev, rhcc.begin()+c_lev+nlevel);
    }

    // Setup nodal projector object
    Hydro::NodalProjector nodal_projector(vel_rebase, GetVecOfConstPtrs(sigma_rebase), mg_geom, info, rhcc_rebase, rhnd_rebase);
    nodal_projector.setDomainBC(mlmg_lobc, mlmg_hibc);

// WARNING: we set the strategy to Sigma to get exactly the same results as the no EB code
// when we don't have interior geometry
//  nodal_projector.getLinOp().setCoarseningStrategy(MLNodeLaplacian::CoarseningStrategy::Sigma);

    // MLNodeLaplacian.define() will set is_rz based on geom.

    nodal_projector.getLinOp().setGaussSeidel(use_gauss_seidel);
    nodal_projector.getLinOp().setHarmonicAverage(use_harmonic_average);
    nodal_projector.getMLMG().setMaxFmgIter(max_fmg_iter);

    if (sync_resid_fine != 0)
    {
        nodal_projector.setSyncResidualFine(sync_resid_fine);
    }
    if (sync_resid_crse != 0)
    {
        nodal_projector.setSyncResidualCrse(sync_resid_crse, parent->refRatio(c_lev), parent->boxArray(c_lev+1));
    }

    //
    // Project to get new P and update velocity
    //
    nodal_projector.project(phi_rebase,rel_tol,abs_tol);

    //
    // Update gradP
    //
    const auto gradphi = nodal_projector.getGradPhi();

    for (int lev = 0; lev < nlevel; lev++)
    {
      NavierStokesBase& ns = *dynamic_cast<NavierStokesBase*>(LevelData[lev+c_lev]);
      MultiFab& Gp = ns.get_new_data(Gradp_Type);

      if ( increment_gp )
      {
	//
	// Add a correction to Gradp
	//
        MultiFab::Add(Gp, *gradphi[lev], 0, 0, AMREX_SPACEDIM, 0);
      }
      else
      {
	//
	// Replace Gradp with the gradient(P) computed in MLMG
	//
	MultiFab::Copy(Gp, *gradphi[lev], 0, 0, AMREX_SPACEDIM, 0);

      }
      //
      // FIXME - could we get away with only FillPatching in predict_velocity
      // and initialPressureProject? I think this would depend on the definition
      // of properly nested... For now, be safe and just fill them.
      // Fill ghost cells
      //
      const Real& time = (ns.state)[Gradp_Type].curTime();
      NavierStokesBase::FillPatch(ns, Gp, Gp.nGrow(), time, Gradp_Type, 0, AMREX_SPACEDIM);
    }
}